

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void nni_stat_register(nni_stat_item *child)

{
  nni_mtx_lock(&stats_lock);
  nni_stat_add(&stats_root,child);
  nni_mtx_unlock(&stats_lock);
  return;
}

Assistant:

void
nni_stat_register(nni_stat_item *child)
{
#ifdef NNG_ENABLE_STATS
	nni_mtx_lock(&stats_lock);
	nni_stat_add(&stats_root, child);
	nni_mtx_unlock(&stats_lock);
#else
	NNI_ARG_UNUSED(child);
#endif
}